

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::InstanceArrayIntersector1>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  Primitive *prim;
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  Precalculations pre;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_24c1;
  RayHit *local_24c0;
  RayQueryContext *local_24b8;
  long local_24b0;
  ulong local_24a8;
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    pauVar17 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    auVar29 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx((undefined1  [16])aVar2,auVar36);
    auVar38._8_4_ = 0x219392ef;
    auVar38._0_8_ = 0x219392ef219392ef;
    auVar38._12_4_ = 0x219392ef;
    auVar36 = vcmpps_avx(auVar36,auVar38,1);
    auVar36 = vblendvps_avx((undefined1  [16])aVar2,auVar38,auVar36);
    auVar38 = vrcpps_avx(auVar36);
    fVar5 = auVar38._0_4_;
    auVar33._0_4_ = auVar36._0_4_ * fVar5;
    fVar6 = auVar38._4_4_;
    auVar33._4_4_ = auVar36._4_4_ * fVar6;
    fVar7 = auVar38._8_4_;
    auVar33._8_4_ = auVar36._8_4_ * fVar7;
    fVar8 = auVar38._12_4_;
    auVar33._12_4_ = auVar36._12_4_ * fVar8;
    auVar39._8_4_ = 0x3f800000;
    auVar39._0_8_ = 0x3f8000003f800000;
    auVar39._12_4_ = 0x3f800000;
    auVar36 = vsubps_avx(auVar39,auVar33);
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23c0._4_4_ = uVar1;
    local_23c0._0_4_ = uVar1;
    local_23c0._8_4_ = uVar1;
    local_23c0._12_4_ = uVar1;
    local_23c0._16_4_ = uVar1;
    local_23c0._20_4_ = uVar1;
    local_23c0._24_4_ = uVar1;
    local_23c0._28_4_ = uVar1;
    auVar40 = ZEXT3264(local_23c0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_23e0._4_4_ = uVar1;
    local_23e0._0_4_ = uVar1;
    local_23e0._8_4_ = uVar1;
    local_23e0._12_4_ = uVar1;
    local_23e0._16_4_ = uVar1;
    local_23e0._20_4_ = uVar1;
    local_23e0._24_4_ = uVar1;
    local_23e0._28_4_ = uVar1;
    auVar41 = ZEXT3264(local_23e0);
    auVar34._0_4_ = fVar5 + fVar5 * auVar36._0_4_;
    auVar34._4_4_ = fVar6 + fVar6 * auVar36._4_4_;
    auVar34._8_4_ = fVar7 + fVar7 * auVar36._8_4_;
    auVar34._12_4_ = fVar8 + fVar8 * auVar36._12_4_;
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2400._4_4_ = uVar1;
    local_2400._0_4_ = uVar1;
    local_2400._8_4_ = uVar1;
    local_2400._12_4_ = uVar1;
    local_2400._16_4_ = uVar1;
    local_2400._20_4_ = uVar1;
    local_2400._24_4_ = uVar1;
    local_2400._28_4_ = uVar1;
    auVar42 = ZEXT3264(local_2400);
    auVar36 = vshufps_avx(auVar34,auVar34,0);
    local_2420._16_16_ = auVar36;
    local_2420._0_16_ = auVar36;
    auVar43 = ZEXT3264(local_2420);
    auVar36 = vmovshdup_avx(auVar34);
    auVar38 = vshufps_avx(auVar34,auVar34,0x55);
    local_2440._16_16_ = auVar38;
    local_2440._0_16_ = auVar38;
    auVar44 = ZEXT3264(local_2440);
    auVar38 = vshufpd_avx(auVar34,auVar34,1);
    auVar33 = vshufps_avx(auVar34,auVar34,0xaa);
    uVar26 = (ulong)(auVar34._0_4_ < 0.0) * 0x20;
    uVar27 = (ulong)(auVar36._0_4_ < 0.0) << 5 | 0x40;
    local_2460._16_16_ = auVar33;
    local_2460._0_16_ = auVar33;
    auVar45 = ZEXT3264(local_2460);
    uVar22 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x80;
    local_24a8 = uVar26 ^ 0x20;
    auVar36 = vshufps_avx(auVar29,auVar29,0);
    local_2480._16_16_ = auVar36;
    local_2480._0_16_ = auVar36;
    auVar46 = ZEXT3264(local_2480);
    auVar36 = vshufps_avx(auVar31,auVar31,0);
    auVar28 = ZEXT3264(CONCAT1616(auVar36,auVar36));
    local_24b8 = context;
    local_24c0 = ray;
LAB_014e53bb:
    do {
      pauVar16 = pauVar17 + -1;
      pauVar17 = pauVar17 + -1;
      if (*(float *)(*pauVar16 + 8) <= (ray->super_RayK<1>).tfar) {
        pauVar16 = pauVar17;
        uVar32 = *(ulong *)*pauVar17;
        while (pauVar17 = pauVar16, (uVar32 & 8) == 0) {
          auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar26),auVar40._0_32_);
          auVar10._4_4_ = auVar43._4_4_ * auVar9._4_4_;
          auVar10._0_4_ = auVar43._0_4_ * auVar9._0_4_;
          auVar10._8_4_ = auVar43._8_4_ * auVar9._8_4_;
          auVar10._12_4_ = auVar43._12_4_ * auVar9._12_4_;
          auVar10._16_4_ = auVar43._16_4_ * auVar9._16_4_;
          auVar10._20_4_ = auVar43._20_4_ * auVar9._20_4_;
          auVar10._24_4_ = auVar43._24_4_ * auVar9._24_4_;
          auVar10._28_4_ = auVar9._28_4_;
          auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar27),auVar41._0_32_);
          auVar11._4_4_ = auVar44._4_4_ * auVar9._4_4_;
          auVar11._0_4_ = auVar44._0_4_ * auVar9._0_4_;
          auVar11._8_4_ = auVar44._8_4_ * auVar9._8_4_;
          auVar11._12_4_ = auVar44._12_4_ * auVar9._12_4_;
          auVar11._16_4_ = auVar44._16_4_ * auVar9._16_4_;
          auVar11._20_4_ = auVar44._20_4_ * auVar9._20_4_;
          auVar11._24_4_ = auVar44._24_4_ * auVar9._24_4_;
          auVar11._28_4_ = auVar9._28_4_;
          auVar9 = vmaxps_avx(auVar10,auVar11);
          auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar22),auVar42._0_32_);
          auVar12._4_4_ = auVar45._4_4_ * auVar10._4_4_;
          auVar12._0_4_ = auVar45._0_4_ * auVar10._0_4_;
          auVar12._8_4_ = auVar45._8_4_ * auVar10._8_4_;
          auVar12._12_4_ = auVar45._12_4_ * auVar10._12_4_;
          auVar12._16_4_ = auVar45._16_4_ * auVar10._16_4_;
          auVar12._20_4_ = auVar45._20_4_ * auVar10._20_4_;
          auVar12._24_4_ = auVar45._24_4_ * auVar10._24_4_;
          auVar12._28_4_ = auVar10._28_4_;
          auVar10 = vmaxps_avx(auVar12,auVar46._0_32_);
          local_24a0 = vmaxps_avx(auVar9,auVar10);
          auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + local_24a8),auVar40._0_32_);
          auVar13._4_4_ = auVar43._4_4_ * auVar9._4_4_;
          auVar13._0_4_ = auVar43._0_4_ * auVar9._0_4_;
          auVar13._8_4_ = auVar43._8_4_ * auVar9._8_4_;
          auVar13._12_4_ = auVar43._12_4_ * auVar9._12_4_;
          auVar13._16_4_ = auVar43._16_4_ * auVar9._16_4_;
          auVar13._20_4_ = auVar43._20_4_ * auVar9._20_4_;
          auVar13._24_4_ = auVar43._24_4_ * auVar9._24_4_;
          auVar13._28_4_ = auVar9._28_4_;
          auVar9 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar27 ^ 0x20)),auVar41._0_32_
                             );
          auVar14._4_4_ = auVar44._4_4_ * auVar9._4_4_;
          auVar14._0_4_ = auVar44._0_4_ * auVar9._0_4_;
          auVar14._8_4_ = auVar44._8_4_ * auVar9._8_4_;
          auVar14._12_4_ = auVar44._12_4_ * auVar9._12_4_;
          auVar14._16_4_ = auVar44._16_4_ * auVar9._16_4_;
          auVar14._20_4_ = auVar44._20_4_ * auVar9._20_4_;
          auVar14._24_4_ = auVar44._24_4_ * auVar9._24_4_;
          auVar14._28_4_ = auVar9._28_4_;
          auVar9 = vminps_avx(auVar13,auVar14);
          auVar10 = vsubps_avx(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar22 ^ 0x20)),
                               auVar42._0_32_);
          auVar15._4_4_ = auVar45._4_4_ * auVar10._4_4_;
          auVar15._0_4_ = auVar45._0_4_ * auVar10._0_4_;
          auVar15._8_4_ = auVar45._8_4_ * auVar10._8_4_;
          auVar15._12_4_ = auVar45._12_4_ * auVar10._12_4_;
          auVar15._16_4_ = auVar45._16_4_ * auVar10._16_4_;
          auVar15._20_4_ = auVar45._20_4_ * auVar10._20_4_;
          auVar15._24_4_ = auVar45._24_4_ * auVar10._24_4_;
          auVar15._28_4_ = auVar10._28_4_;
          auVar10 = vminps_avx(auVar15,auVar28._0_32_);
          auVar9 = vminps_avx(auVar9,auVar10);
          auVar9 = vcmpps_avx(local_24a0,auVar9,2);
          uVar25 = vmovmskps_avx(auVar9);
          if (uVar25 == 0) {
            if (pauVar17 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            goto LAB_014e53bb;
          }
          uVar25 = uVar25 & 0xff;
          uVar18 = uVar32 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (uVar25 != 0) {
            for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          uVar32 = *(ulong *)(uVar18 + lVar19 * 8);
          uVar25 = uVar25 - 1 & uVar25;
          pauVar16 = pauVar17;
          if (uVar25 != 0) {
            uVar3 = *(uint *)(local_24a0 + lVar19 * 4);
            lVar19 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar20 = *(ulong *)(uVar18 + lVar19 * 8);
            uVar4 = *(uint *)(local_24a0 + lVar19 * 4);
            uVar25 = uVar25 - 1 & uVar25;
            if (uVar25 == 0) {
              pauVar16 = pauVar17 + 1;
              if (uVar3 < uVar4) {
                *(ulong *)*pauVar17 = uVar20;
                *(uint *)(*pauVar17 + 8) = uVar4;
              }
              else {
                *(ulong *)*pauVar17 = uVar32;
                *(uint *)(*pauVar17 + 8) = uVar3;
                uVar32 = uVar20;
              }
            }
            else {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar32;
              auVar36 = vpunpcklqdq_avx(auVar29,ZEXT416(uVar3));
              auVar31._8_8_ = 0;
              auVar31._0_8_ = uVar20;
              auVar29 = vpunpcklqdq_avx(auVar31,ZEXT416(uVar4));
              lVar19 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              auVar35._8_8_ = 0;
              auVar35._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
              auVar31 = vpunpcklqdq_avx(auVar35,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
              uVar25 = uVar25 - 1 & uVar25;
              if (uVar25 == 0) {
                auVar38 = vpcmpgtd_avx(auVar29,auVar36);
                auVar33 = vpshufd_avx(auVar38,0xaa);
                auVar38 = vblendvps_avx(auVar29,auVar36,auVar33);
                auVar36 = vblendvps_avx(auVar36,auVar29,auVar33);
                auVar29 = vpcmpgtd_avx(auVar31,auVar38);
                auVar33 = vpshufd_avx(auVar29,0xaa);
                auVar29 = vblendvps_avx(auVar31,auVar38,auVar33);
                auVar31 = vblendvps_avx(auVar38,auVar31,auVar33);
                auVar38 = vpcmpgtd_avx(auVar31,auVar36);
                auVar33 = vpshufd_avx(auVar38,0xaa);
                auVar38 = vblendvps_avx(auVar31,auVar36,auVar33);
                auVar36 = vblendvps_avx(auVar36,auVar31,auVar33);
                *pauVar17 = auVar36;
                pauVar17[1] = auVar38;
                uVar32 = auVar29._0_8_;
                pauVar16 = pauVar17 + 2;
              }
              else {
                lVar19 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                auVar37._8_8_ = 0;
                auVar37._0_8_ = *(ulong *)(uVar18 + lVar19 * 8);
                auVar38 = vpunpcklqdq_avx(auVar37,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
                uVar25 = uVar25 - 1 & uVar25;
                uVar20 = (ulong)uVar25;
                if (uVar25 == 0) {
                  auVar33 = vpcmpgtd_avx(auVar29,auVar36);
                  auVar34 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar29,auVar36,auVar34);
                  auVar36 = vblendvps_avx(auVar36,auVar29,auVar34);
                  auVar29 = vpcmpgtd_avx(auVar38,auVar31);
                  auVar34 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar38,auVar31,auVar34);
                  auVar31 = vblendvps_avx(auVar31,auVar38,auVar34);
                  auVar38 = vpcmpgtd_avx(auVar31,auVar36);
                  auVar34 = vpshufd_avx(auVar38,0xaa);
                  auVar38 = vblendvps_avx(auVar31,auVar36,auVar34);
                  auVar36 = vblendvps_avx(auVar36,auVar31,auVar34);
                  auVar31 = vpcmpgtd_avx(auVar29,auVar33);
                  auVar34 = vpshufd_avx(auVar31,0xaa);
                  auVar31 = vblendvps_avx(auVar29,auVar33,auVar34);
                  auVar29 = vblendvps_avx(auVar33,auVar29,auVar34);
                  auVar33 = vpcmpgtd_avx(auVar38,auVar29);
                  auVar34 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar38,auVar29,auVar34);
                  auVar29 = vblendvps_avx(auVar29,auVar38,auVar34);
                  *pauVar17 = auVar36;
                  pauVar17[1] = auVar29;
                  pauVar17[2] = auVar33;
                  uVar32 = auVar31._0_8_;
                  pauVar16 = pauVar17 + 3;
                }
                else {
                  *pauVar17 = auVar36;
                  pauVar17[1] = auVar29;
                  pauVar17[2] = auVar31;
                  pauVar17[3] = auVar38;
                  lVar19 = 0x30;
                  do {
                    lVar23 = lVar19;
                    lVar19 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                      }
                    }
                    uVar32 = *(ulong *)(uVar18 + lVar19 * 8);
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = uVar32;
                    auVar36 = vpunpcklqdq_avx(auVar30,ZEXT416(*(uint *)(local_24a0 + lVar19 * 4)));
                    *(undefined1 (*) [16])(pauVar17[1] + lVar23) = auVar36;
                    uVar20 = uVar20 & uVar20 - 1;
                    lVar19 = lVar23 + 0x10;
                  } while (uVar20 != 0);
                  pauVar16 = (undefined1 (*) [16])(pauVar17[1] + lVar23);
                  if (lVar23 + 0x10 != 0) {
                    lVar19 = 0x10;
                    pauVar21 = pauVar17;
                    do {
                      auVar36 = pauVar21[1];
                      pauVar21 = pauVar21 + 1;
                      uVar25 = vextractps_avx(auVar36,2);
                      lVar23 = lVar19;
                      do {
                        if (uVar25 <= *(uint *)(pauVar17[-1] + lVar23 + 8)) {
                          pauVar24 = (undefined1 (*) [16])(*pauVar17 + lVar23);
                          break;
                        }
                        *(undefined1 (*) [16])(*pauVar17 + lVar23) =
                             *(undefined1 (*) [16])(pauVar17[-1] + lVar23);
                        lVar23 = lVar23 + -0x10;
                        pauVar24 = pauVar17;
                      } while (lVar23 != 0);
                      *pauVar24 = auVar36;
                      lVar19 = lVar19 + 0x10;
                    } while (pauVar16 != pauVar21);
                    uVar32 = *(ulong *)*pauVar16;
                  }
                }
              }
            }
          }
        }
        local_24b0 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_24b0 != 0) {
          prim = (Primitive *)(uVar32 & 0xfffffffffffffff0);
          do {
            InstanceArrayIntersector1::intersect(&local_24c1,ray,context,prim);
            prim = prim + 1;
            local_24b0 = local_24b0 + -1;
            context = local_24b8;
            ray = local_24c0;
          } while (local_24b0 != 0);
        }
        fVar5 = (ray->super_RayK<1>).tfar;
        auVar28 = ZEXT3264(CONCAT428(fVar5,CONCAT424(fVar5,CONCAT420(fVar5,CONCAT416(fVar5,CONCAT412
                                                  (fVar5,CONCAT48(fVar5,CONCAT44(fVar5,fVar5))))))))
        ;
        auVar40 = ZEXT3264(local_23c0);
        auVar41 = ZEXT3264(local_23e0);
        auVar42 = ZEXT3264(local_2400);
        auVar43 = ZEXT3264(local_2420);
        auVar44 = ZEXT3264(local_2440);
        auVar45 = ZEXT3264(local_2460);
        auVar46 = ZEXT3264(local_2480);
      }
    } while (pauVar17 != (undefined1 (*) [16])&local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }